

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O0

int __thiscall glslang::TPpContext::CPPerror(TPpContext *this,TPpToken *ppToken)

{
  TParseContextBase *pTVar1;
  ulong uVar2;
  undefined8 uVar3;
  TString *local_58;
  TSourceLoc loc;
  string message;
  int token;
  TPpToken *ppToken_local;
  TPpContext *this_local;
  
  this->disableEscapeSequences = true;
  message.field_2._12_4_ = scanToken(this,ppToken);
  this->disableEscapeSequences = false;
  std::__cxx11::string::string((string *)&loc.column);
  local_58 = (ppToken->loc).name;
  loc.name = *(TString **)&(ppToken->loc).string;
  loc.string = (ppToken->loc).column;
  loc.line = *(int *)&(ppToken->loc).field_0x14;
  while (message.field_2._12_4_ != 10 && message.field_2._12_4_ != -1) {
    if ((((((message.field_2._12_4_ == 0x9c) || (message.field_2._12_4_ == 0x9d)) ||
          (message.field_2._12_4_ == 0x98)) ||
         ((message.field_2._12_4_ == 0x99 || (message.field_2._12_4_ == 0x9a)))) ||
        ((message.field_2._12_4_ == 0x9b ||
         ((message.field_2._12_4_ == 0xa0 || (message.field_2._12_4_ == 0x9e)))))) ||
       (message.field_2._12_4_ == 0x9f)) {
      std::__cxx11::string::append((char *)&loc.column);
    }
    else if ((message.field_2._12_4_ == 0xa2) || (message.field_2._12_4_ == 0xa1)) {
      std::__cxx11::string::append((char *)&loc.column);
    }
    else {
      TStringAtomMap::getString(&this->atomStrings,message.field_2._12_4_);
      std::__cxx11::string::append((char *)&loc.column);
    }
    std::__cxx11::string::append((char *)&loc.column);
    message.field_2._12_4_ = scanToken(this,ppToken);
  }
  pTVar1 = this->parseContext;
  uVar2 = (ulong)loc.name >> 0x20;
  uVar3 = std::__cxx11::string::c_str();
  (*(pTVar1->super_TParseVersions)._vptr_TParseVersions[0x3d])(pTVar1,uVar2,uVar3);
  pTVar1 = this->parseContext;
  uVar3 = std::__cxx11::string::c_str();
  (*(pTVar1->super_TParseVersions)._vptr_TParseVersions[0x2f])(pTVar1,&local_58,uVar3,"#error","");
  std::__cxx11::string::~string((string *)&loc.column);
  return 10;
}

Assistant:

int TPpContext::CPPerror(TPpToken* ppToken)
{
    disableEscapeSequences = true;
    int token = scanToken(ppToken);
    disableEscapeSequences = false;
    std::string message;
    TSourceLoc loc = ppToken->loc;

    while (token != '\n' && token != EndOfInput) {
        if (token == PpAtomConstInt16 || token == PpAtomConstUint16 ||
            token == PpAtomConstInt   || token == PpAtomConstUint   ||
            token == PpAtomConstInt64 || token == PpAtomConstUint64 ||
            token == PpAtomConstFloat16 ||
            token == PpAtomConstFloat || token == PpAtomConstDouble) {
                message.append(ppToken->name);
        } else if (token == PpAtomIdentifier || token == PpAtomConstString) {
            message.append(ppToken->name);
        } else {
            message.append(atomStrings.getString(token));
        }
        message.append(" ");
        token = scanToken(ppToken);
    }
    parseContext.notifyErrorDirective(loc.line, message.c_str());
    // store this msg into the shader's information log..set the Compile Error flag!!!!
    parseContext.ppError(loc, message.c_str(), "#error", "");

    return '\n';
}